

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::GenerateFastLdLen(Lowerer *this,Instr *ldLen,bool *instrIsInHelperBlockRef)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  OpndKind OVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  LabelInstr *isNotObjectLabel;
  ArrayRegOpnd *this_01;
  StackSym *pSVar8;
  ArrayRegOpnd *pAVar9;
  IndirOpnd *pIVar10;
  IntConstOpnd *pIVar11;
  LabelInstr *pLVar12;
  Opnd *dst;
  LabelInstr *labelFallThru;
  Lowerer *pLVar13;
  byte bVar14;
  undefined1 local_b8 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  AutoReuseOpnd autoReuseLengthOpnd;
  uint32 local_64;
  LabelInstr *local_58;
  LabelInstr *local_48;
  RegOpnd *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  byte local_31;
  ValueType srcValueType;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4c1b,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar2) goto LAB_005b0606;
    *puVar7 = 0;
  }
  *instrIsInHelperBlockRef = false;
  this_00 = ldLen->m_dst;
  this_01 = (ArrayRegOpnd *)ldLen->m_src1;
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005b0606;
    *puVar7 = 0;
  }
  local_34 = (this_01->super_RegOpnd).super_Opnd.m_valueType.field_0;
  isNotObjectLabel = IR::LabelInstr::New(Label,this->m_func,true);
  pLVar13 = (Lowerer *)ldLen;
  bVar2 = IR::Instr::DoStackArgsOpt(ldLen);
  if (bVar2) {
    IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    GenerateFastArgumentsLdLen(this,ldLen,labelFallThru);
    IR::Instr::Remove(ldLen);
    return false;
  }
  local_31 = ShouldGenerateArrayFastPath(pLVar13,(Opnd *)this_01,false,true,false);
  bVar2 = ValueType::IsUninitialized((ValueType *)&local_34.field_0);
  bVar4 = true;
  if (!bVar2) {
    bVar4 = ValueType::HasBeenString((ValueType *)&local_34.field_0);
  }
  bVar14 = local_31 | bVar4;
  if (bVar14 != 1) {
    bVar2 = false;
    goto LAB_005b05d0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  OVar5 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 == OpndKindReg) {
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
    }
  }
  else {
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
    }
    pSVar8 = (this_01->super_RegOpnd).m_sym;
    if ((pSVar8->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
    }
    this_01 = (ArrayRegOpnd *)IR::RegOpnd::New(*(StackSym **)&pSVar8->m_offset,TyVar,this->m_func);
    IR::Instr::ReplaceSrc1(ldLen,(Opnd *)this_01);
  }
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_34.field_0);
  local_64 = 0x20;
  if (bVar2) {
    local_64 = GetArrayOffsetOfLength((ValueType)local_34.field_0);
  }
  autoReuseArrayOpnd.autoDelete = false;
  autoReuseArrayOpnd.wasInUse = false;
  autoReuseArrayOpnd._18_6_ = 0;
  autoReuseArrayLengthOpnd.func._1_1_ = 1;
  pAVar9 = this_01;
  if (local_31 == 0) {
LAB_005b0090:
    local_58 = (LabelInstr *)0x0;
    local_40 = (RegOpnd *)0x0;
  }
  else {
    bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_34.field_0);
    if (bVar2) {
      bVar2 = IR::RegOpnd::IsArrayRegOpnd(&this_01->super_RegOpnd);
      if (bVar2) {
        bVar2 = IR::RegOpnd::IsArrayRegOpnd(&this_01->super_RegOpnd);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
          if (!bVar2) goto LAB_005b0606;
          *puVar7 = 0;
        }
        pSVar8 = IR::ArrayRegOpnd::LengthSym(this_01);
        if (pSVar8 != (StackSym *)0x0) {
          pSVar8 = IR::ArrayRegOpnd::LengthSym(this_01);
          local_40 = IR::RegOpnd::New(pSVar8,TyUint32,this->m_func);
          local_40->field_0x18 = local_40->field_0x18 | 0x40;
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete,&local_40->super_Opnd,
                     this->m_func,true);
          local_58 = (LabelInstr *)0x0;
          goto LAB_005b00fc;
        }
      }
      goto LAB_005b0090;
    }
    if (bVar4 == false) {
      local_58 = (LabelInstr *)0x0;
      pLVar12 = isNotObjectLabel;
    }
    else {
      local_58 = IR::LabelInstr::New(Label,this->m_func,false);
      pLVar12 = local_58;
    }
    local_40 = (RegOpnd *)0x0;
    pAVar9 = (ArrayRegOpnd *)
             GenerateArrayTest(this,&this_01->super_RegOpnd,isNotObjectLabel,pLVar12,ldLen,false,
                               false,false);
  }
LAB_005b00fc:
  local_b8 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_b8,(Opnd *)pAVar9,this->m_func,true);
  autoReuseArrayLengthOpnd.autoDelete = false;
  autoReuseArrayLengthOpnd.wasInUse = false;
  autoReuseArrayLengthOpnd._18_6_ = 0;
  if (local_31 == 0) {
    local_40 = (RegOpnd *)0x0;
LAB_005b0203:
    if (bVar4 != false) {
      if (local_31 == 0) {
        local_48 = (LabelInstr *)0x0;
      }
      else {
        local_48 = IR::LabelInstr::New(Label,this->m_func,false);
        InsertBranch(Br,false,local_48,ldLen);
        IR::Instr::InsertBefore(ldLen,&local_58->super_Instr);
      }
      GenerateStringTest(this,&this_01->super_RegOpnd,ldLen,isNotObjectLabel,(LabelInstr *)0x0,
                         (bool)(local_31 ^ 1));
      if (local_40 == (RegOpnd *)0x0) {
        local_40 = IR::RegOpnd::New(TyUint32,this->m_func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete,&local_40->super_Opnd,
                   this->m_func,true);
      }
      pIVar10 = IR::IndirOpnd::New(&this_01->super_RegOpnd,0x18,TyUint32,this->m_func,false);
      InsertMove(&local_40->super_Opnd,&pIVar10->super_Opnd,ldLen,true);
      if (local_31 != 0) {
        IR::Instr::InsertBefore(ldLen,&local_48->super_Instr);
      }
    }
  }
  else {
    if (local_40 == (RegOpnd *)0x0) {
      local_40 = IR::RegOpnd::New(TyUint32,this->m_func);
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete,&local_40->super_Opnd,
                 this->m_func,true);
      pIVar10 = IR::IndirOpnd::New(&pAVar9->super_RegOpnd,local_64,TyUint32,this->m_func,false);
      InsertMove(&local_40->super_Opnd,&pIVar10->super_Opnd,ldLen,true);
      goto LAB_005b0203;
    }
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete,&local_40->super_Opnd,
               this->m_func,true);
    if (bVar4 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4c92,"(!stringFastPath)","!stringFastPath");
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
      goto LAB_005b0203;
    }
  }
  if (local_40 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4cba,"(lengthOpnd)","lengthOpnd");
    if (!bVar2) goto LAB_005b0606;
    *puVar7 = 0;
  }
  if (((ldLen->field_0x38 & 0x10) == 0) ||
     (BVar6 = IR::Instr::GetBailOutKind(ldLen),
     (BVar6 & ~BailOutKindBits) != BailOutOnIrregularLength)) {
    pLVar13 = (Lowerer *)0x0;
    pIVar11 = IR::IntConstOpnd::New(0,(local_40->super_Opnd).m_type,this->m_func,true);
    InsertCompareBranch(pLVar13,&local_40->super_Opnd,&pIVar11->super_Opnd,BrLt_A,false,
                        isNotObjectLabel,ldLen,false);
    if (this_00->m_type != TyVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cf5,"(dst->GetType() == TyVar)","dst->GetType() == TyVar");
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
    }
    dst = IR::Opnd::Copy(this_00,this->m_func);
    dst->m_type = TyInt32;
    InsertMove(dst,&local_40->super_Opnd,ldLen,true);
    LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,this_00,ldLen);
    pLVar12 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    bVar2 = true;
    InsertBranch(Br,false,pLVar12,ldLen);
  }
  else {
    BVar6 = IR::Instr::GetBailOutKind(ldLen);
    if ((BVar6 != BailOutOnIrregularLength) && (bVar2 = IR::Instr::HasLazyBailOut(ldLen), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbe,
                         "(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut())"
                         ,
                         "ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut()"
                        );
      if (!bVar2) goto LAB_005b0606;
      *puVar7 = 0;
    }
    if (this_00->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbf,"(dst->IsInt32())","dst->IsInt32()");
      if (!bVar2) {
LAB_005b0606:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    pLVar13 = (Lowerer *)0x0;
    pIVar11 = IR::IntConstOpnd::New(0,(local_40->super_Opnd).m_type,this->m_func,true);
    InsertCompareBranch(pLVar13,&local_40->super_Opnd,&pIVar11->super_Opnd,BrLt_A,false,
                        isNotObjectLabel,ldLen,false);
    InsertMove(this_00,&local_40->super_Opnd,ldLen,true);
    pLVar12 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    InsertBranch(Br,false,pLVar12,ldLen);
    IR::Instr::InsertBefore(ldLen,&isNotObjectLabel->super_Instr);
    *instrIsInHelperBlockRef = true;
    IR::Instr::FreeDst(ldLen);
    IR::Instr::FreeSrc1(ldLen);
    bVar2 = false;
    GenerateBailOut(this,ldLen,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayLengthOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b8);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseArrayOpnd.autoDelete);
LAB_005b05d0:
  if (bVar2) {
    IR::Instr::InsertBefore(ldLen,&isNotObjectLabel->super_Instr);
    *instrIsInHelperBlockRef = true;
    bVar14 = 1;
  }
  else {
    bVar14 = bVar14 ^ 1;
  }
  return (bool)bVar14;
}

Assistant:

bool
Lowerer::GenerateFastLdLen(IR::Instr *ldLen, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    //     TEST src, AtomTag                  -- check src not tagged int
    //     JNE $helper
    //     CMP [src], JavascriptArray::`vtable' -- check base isArray
    //     JNE $string
    //     MOV length, [src + offset(length)]     -- Load array length
    //     JMP $tovar
    // $string:
    //     CMP [src + offset(type)], static_string_type -- check src isString
    //     JNE $helper
    //     MOV length, [src + offset(length)]     -- Load string length
    // $toVar:
    //     TEST length, 0xC0000000       -- test for overflow of SHL, or negative
    //     JNE $helper
    //     SHL length, Js::VarTag_Shift  -- restore the var tag on the result
    //     INC length
    //     MOV dst, length
    //     JMP $fallthru
    // $helper:
    //     CALL GetProperty(src, length_property_id, scriptContext)
    // $fallthru:

    IR::Opnd *          opnd = ldLen->GetSrc1();
    IR::RegOpnd *       dst = ldLen->GetDst()->AsRegOpnd();
    const ValueType     srcValueType(opnd->GetValueType());

    IR::LabelInstr *const labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (ldLen->DoStackArgsOpt())
    {
        GenerateFastArgumentsLdLen(ldLen, ldLen->GetOrCreateContinueLabel());
        ldLen->Remove();
        return false;
    }
    else
    {
        const bool arrayFastPath = ShouldGenerateArrayFastPath(opnd, false, true, false);

        // HasBeenString instead of IsLikelyString because it could be a merge between StringObject and String, and this
        // information about whether it's a StringObject or some other object is not available in the profile data
        const bool stringFastPath = srcValueType.IsUninitialized() || srcValueType.HasBeenString();

        if(!(arrayFastPath || stringFastPath))
        {
            return true;
        }

        IR::RegOpnd * src;
        if (opnd->IsRegOpnd())
        {
            src = opnd->AsRegOpnd();
        }
        else
        {
            // LdLen has a PropertySymOpnd until globopt where the decision whether to convert it to LdFld is made. If globopt is skipped, the opnd will
            // still be a PropertySymOpnd here. In that case, do the conversion here.
            IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
            PropertySym * propertySym = symOpnd->m_sym->AsPropertySym();
            src = IR::RegOpnd::New(propertySym->m_stackSym, IRType::TyVar, this->m_func);
            ldLen->ReplaceSrc1(src);
            opnd = src;
        }

        const int32 arrayOffsetOfLength =
            srcValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayOffsetOfLength(srcValueType)
                : Js::JavascriptArray::GetOffsetOfLength();
        IR::LabelInstr *labelString = nullptr;
        IR::RegOpnd *arrayOpnd = src;
        IR::RegOpnd *arrayLengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
        if(arrayFastPath)
        {
            if(!srcValueType.IsAnyOptimizedArray())
            {
                if(stringFastPath)
                {
                    // If we don't have info about the src value type or its object type, the array and string fast paths are
                    // generated
                    labelString = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                }

                arrayOpnd = GenerateArrayTest(src, labelHelper, stringFastPath ? labelString : labelHelper, ldLen, false);
            }
            else if(src->IsArrayRegOpnd())
            {
                IR::ArrayRegOpnd *const arrayRegOpnd = src->AsArrayRegOpnd();
                if(arrayRegOpnd->LengthSym())
                {
                    arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), TyUint32, m_func);
                    DebugOnly(arrayLengthOpnd->FreezeSymValue());
                    autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
                }
            }
        }
        const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

        IR::RegOpnd *lengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseLengthOpnd;
        const auto EnsureLengthOpnd = [&]()
        {
            if(lengthOpnd)
            {
                return;
            }

            lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
            autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
        };

        if(arrayFastPath)
        {
            if(arrayLengthOpnd)
            {
                lengthOpnd = arrayLengthOpnd;
                autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
                Assert(!stringFastPath);
            }
            else
            {
                //     MOV length, [array + offset(length)]     -- Load array length
                EnsureLengthOpnd();
                IR::IndirOpnd *const indirOpnd = IR::IndirOpnd::New(arrayOpnd, arrayOffsetOfLength, TyUint32, this->m_func);
                InsertMove(lengthOpnd, indirOpnd, ldLen);
            }
        }

        if(stringFastPath)
        {
            IR::LabelInstr *labelToVar = nullptr;
            if(arrayFastPath)
            {
                //     JMP $tovar
                labelToVar = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                InsertBranch(Js::OpCode::Br, labelToVar, ldLen);

                // $string:
                ldLen->InsertBefore(labelString);
            }

            //  CMP [src + offset(type)], static_stringtype -- check src isString
            //  JNE $helper
            GenerateStringTest(src, ldLen, labelHelper, nullptr, !arrayFastPath);

            //  MOV length, [src + offset(length)]     -- Load string length
            EnsureLengthOpnd();
            IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(src, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func);
            InsertMove(lengthOpnd, indirOpnd, ldLen);

            if(arrayFastPath)
            {
                // $toVar:
                ldLen->InsertBefore(labelToVar);
            }
        }

        Assert(lengthOpnd);

        if(ldLen->HasBailOutInfo() && (ldLen->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnIrregularLength)
        {
            Assert(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut());
            Assert(dst->IsInt32());

            // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
            //     test length, length
            //     js $helper
            //     mov dst, length
            //     jmp $fallthrough
            InsertCompareBranch(
                lengthOpnd,
                IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
                Js::OpCode::BrLt_A,
                labelHelper,
                ldLen);
            InsertMove(dst, lengthOpnd, ldLen);
            InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);

            // $helper:
            //     (Bail out with IR::BailOutOnIrregularLength)
            ldLen->InsertBefore(labelHelper);
            instrIsInHelperBlock = true;
            ldLen->FreeDst();
            ldLen->FreeSrc1();
            GenerateBailOut(ldLen);
            return false;
        }

    #if INT32VAR
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
        //     test length, length
        //     js $helper
        InsertCompareBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
            Js::OpCode::BrLt_A,
            labelHelper,
            ldLen);
    #else
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative.
        // Additionally, verify that the signed value's width is not greater than 31 bits, since it needs to be tagged.
        //     test length, 0xC0000000
        //     jne $helper
        InsertTestBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0xC0000000, TyUint32, this->m_func, true),
            Js::OpCode::BrNeq_A,
            labelHelper,
            ldLen);
    #endif

    #if INT32VAR
        //
        // dst_32 = MOV length
        // dst_64 = OR dst_64, Js::AtomTag_IntPtr
        //
        Assert(dst->GetType() == TyVar);

        IR::Opnd *dst32 = dst->Copy(this->m_func);
        dst32->SetType(TyInt32);

        // This will clear the top bits.
        InsertMove(dst32, lengthOpnd, ldLen);

        m_lowererMD.GenerateInt32ToVarConversion(dst, ldLen);
    #else
        // dst = SHL length, Js::VarTag_Shift  -- restore the var tag on the result
        InsertShift(
            Js::OpCode::Shl_A,
            false /* needFlags */,
            dst,
            lengthOpnd,
            IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, this->m_func),
            ldLen);

        // dst = ADD dst, AtomTag
        InsertAdd(
            false /* needFlags */,
            dst,
            dst,
            IR::IntConstOpnd::New(Js::AtomTag_Int32, TyUint32, m_func, true),
            ldLen);
    #endif

        //  JMP $fallthrough
        InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);
    }

    // $helper:
    //      (caller generates helper call)
    ldLen->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    return true; // fast path was generated, helper call will be in a helper block
}